

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLayerNormalizationWrongGammaOrBeta(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  ConvolutionLayerParams *pCVar3;
  Rep *pRVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  Arena *pAVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  ModelDescription *pMVar13;
  Type *pTVar14;
  FeatureType *pFVar15;
  ArrayFeatureType *pAVar16;
  TypeUnion this;
  Type *this_00;
  LayerNormalizationLayerParams *this_01;
  WeightParams *pWVar17;
  QuantizationParams *pQVar18;
  ostream *poVar19;
  string *psVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  Result res1;
  Model m;
  Result res4;
  Result res3;
  Result res2;
  undefined1 local_e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  Model local_c0;
  Result local_90;
  Result local_68;
  Result local_40;
  
  CoreML::Specification::Model::Model(&local_c0);
  if (local_c0.description_ == (ModelDescription *)0x0) {
    pMVar13 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar13);
    local_c0.description_ = pMVar13;
  }
  pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&((local_c0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_e8 + 0x10;
  local_e8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar14->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar14->type_ == (FeatureType *)0x0) {
    pFVar15 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar15);
    pTVar14->type_ = pFVar15;
  }
  pFVar15 = pTVar14->type_;
  if (pFVar15->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar15);
    pFVar15->_oneof_case_[0] = 5;
    pAVar16 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar16);
    (pFVar15->Type_).multiarraytype_ = pAVar16;
  }
  pAVar16 = (pFVar15->Type_).multiarraytype_;
  pRVar1 = &pAVar16->shape_;
  iVar23 = (pAVar16->shape_).total_size_;
  if ((pAVar16->shape_).current_size_ == iVar23) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar23 + 1);
  }
  iVar23 = (pAVar16->shape_).current_size_;
  iVar22 = iVar23 + 1;
  (pAVar16->shape_).current_size_ = iVar22;
  ((pAVar16->shape_).rep_)->elements[iVar23] = 3;
  iVar23 = (pAVar16->shape_).total_size_;
  if (iVar22 == iVar23) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar23 + 1);
  }
  iVar23 = (pAVar16->shape_).current_size_;
  iVar22 = iVar23 + 1;
  (pAVar16->shape_).current_size_ = iVar22;
  ((pAVar16->shape_).rep_)->elements[iVar23] = 5;
  iVar23 = (pAVar16->shape_).total_size_;
  if (iVar22 == iVar23) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar23 + 1);
  }
  iVar23 = (pAVar16->shape_).current_size_;
  (pAVar16->shape_).current_size_ = iVar23 + 1;
  ((pAVar16->shape_).rep_)->elements[iVar23] = 2;
  if (local_c0.description_ == (ModelDescription *)0x0) {
    pMVar13 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar13);
    local_c0.description_ = pMVar13;
  }
  pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&((local_c0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_e8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar14->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_e8);
  if ((pointer)local_e8._0_8_ != pcVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  if (pTVar14->type_ == (FeatureType *)0x0) {
    pFVar15 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar15);
    pTVar14->type_ = pFVar15;
  }
  pFVar15 = pTVar14->type_;
  if (pFVar15->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar15);
    pFVar15->_oneof_case_[0] = 5;
    pAVar16 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar16);
    (pFVar15->Type_).multiarraytype_ = pAVar16;
  }
  pAVar16 = (pFVar15->Type_).multiarraytype_;
  pRVar1 = &pAVar16->shape_;
  iVar23 = (pAVar16->shape_).total_size_;
  if ((pAVar16->shape_).current_size_ == iVar23) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar23 + 1);
  }
  iVar23 = (pAVar16->shape_).current_size_;
  iVar22 = iVar23 + 1;
  (pAVar16->shape_).current_size_ = iVar22;
  ((pAVar16->shape_).rep_)->elements[iVar23] = 3;
  iVar23 = (pAVar16->shape_).total_size_;
  if (iVar22 == iVar23) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar23 + 1);
  }
  iVar23 = (pAVar16->shape_).current_size_;
  iVar22 = iVar23 + 1;
  (pAVar16->shape_).current_size_ = iVar22;
  ((pAVar16->shape_).rep_)->elements[iVar23] = 5;
  iVar23 = (pAVar16->shape_).total_size_;
  if (iVar22 == iVar23) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar23 + 1);
  }
  iVar23 = (pAVar16->shape_).current_size_;
  (pAVar16->shape_).current_size_ = iVar23 + 1;
  ((pAVar16->shape_).rep_)->elements[iVar23] = 2;
  if (local_c0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_c0);
    local_c0._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_c0.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_c0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_c0.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] != 0x546) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x546;
    this_01 = (LayerNormalizationLayerParams *)operator_new(0x40);
    CoreML::Specification::LayerNormalizationLayerParams::LayerNormalizationLayerParams(this_01);
    (this_00->layer_).layernormalization_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  iVar23 = (pCVar3->kernelsize_).total_size_;
  if ((pCVar3->kernelsize_).current_size_ == iVar23) {
    google::protobuf::RepeatedField<long>::Reserve
              ((RepeatedField<long> *)&pCVar3->kernelsize_,iVar23 + 1);
  }
  iVar23 = (pCVar3->kernelsize_).current_size_;
  (pCVar3->kernelsize_).current_size_ = iVar23 + 1;
  ((pCVar3->kernelsize_).rep_)->elements[iVar23] = 1;
  lVar21._0_4_ = (pCVar3->stride_).current_size_;
  lVar21._4_4_ = (pCVar3->stride_).total_size_;
  if (lVar21 == 0) {
    pWVar17 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar17);
    *(WeightParams **)&pCVar3->stride_ = pWVar17;
  }
  lVar21 = *(long *)&pCVar3->stride_;
  if (*(int *)(lVar21 + 0x10) == *(int *)(lVar21 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar21 + 0x10),*(int *)(lVar21 + 0x14) + 1);
  }
  iVar23 = *(int *)(lVar21 + 0x10);
  *(int *)(lVar21 + 0x10) = iVar23 + 1;
  *(undefined4 *)(*(long *)(lVar21 + 0x18) + 8 + (long)iVar23 * 4) = 0x3f800000;
  if ((pCVar3->stride_).rep_ == (Rep *)0x0) {
    pWVar17 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar17);
    (pCVar3->stride_).rep_ = (Rep *)pWVar17;
  }
  pRVar4 = (pCVar3->stride_).rep_;
  iVar23 = *(int *)((long)&pRVar4[1].arena + 4);
  if (*(int *)&pRVar4[1].arena == iVar23) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)(pRVar4 + 1),iVar23 + 1)
    ;
  }
  iVar23 = *(int *)&pRVar4[1].arena;
  *(int *)&pRVar4[1].arena = iVar23 + 1;
  *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar23 * 4) = 0x3f800000;
  lVar5._0_4_ = (pCVar3->stride_).current_size_;
  lVar5._4_4_ = (pCVar3->stride_).total_size_;
  if (lVar5 == 0) {
    pWVar17 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar17);
    *(WeightParams **)&pCVar3->stride_ = pWVar17;
  }
  lVar21 = *(long *)&pCVar3->stride_;
  if (*(long *)(lVar21 + 0x40) == 0) {
    pQVar18 = (QuantizationParams *)operator_new(0x28);
    CoreML::Specification::QuantizationParams::QuantizationParams(pQVar18);
    *(QuantizationParams **)(lVar21 + 0x40) = pQVar18;
  }
  CoreML::validate<(MLModelType)500>((Result *)local_e8,&local_c0);
  bVar12 = CoreML::Result::good((Result *)local_e8);
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x170c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  }
  else {
    psVar20 = CoreML::Result::message_abi_cxx11_((Result *)local_e8);
    lVar21 = std::__cxx11::string::find((char *)psVar20,0x302c17,0);
    if (lVar21 != -1) {
      lVar6._0_4_ = (pCVar3->stride_).current_size_;
      lVar6._4_4_ = (pCVar3->stride_).total_size_;
      if (lVar6 == 0) {
        pWVar17 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar17);
        *(WeightParams **)&pCVar3->stride_ = pWVar17;
      }
      lVar21 = *(long *)&pCVar3->stride_;
      *(undefined4 *)(lVar21 + 0x10) = 0;
      if (lVar21 == 0) {
        pWVar17 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar17);
        *(WeightParams **)&pCVar3->stride_ = pWVar17;
      }
      lVar21 = *(long *)&pCVar3->stride_;
      if (*(int *)(lVar21 + 0x10) == *(int *)(lVar21 + 0x14)) {
        google::protobuf::RepeatedField<float>::Reserve
                  ((RepeatedField<float> *)(lVar21 + 0x10),*(int *)(lVar21 + 0x14) + 1);
      }
      iVar23 = *(int *)(lVar21 + 0x10);
      *(int *)(lVar21 + 0x10) = iVar23 + 1;
      *(undefined4 *)(*(long *)(lVar21 + 0x18) + 8 + (long)iVar23 * 4) = 0x3f800000;
      if ((pCVar3->stride_).rep_ == (Rep *)0x0) {
        pWVar17 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar17);
        (pCVar3->stride_).rep_ = (Rep *)pWVar17;
      }
      pRVar4 = (pCVar3->stride_).rep_;
      iVar23 = *(int *)((long)&pRVar4[1].arena + 4);
      if (*(int *)&pRVar4[1].arena == iVar23) {
        google::protobuf::RepeatedField<float>::Reserve
                  ((RepeatedField<float> *)(pRVar4 + 1),iVar23 + 1);
      }
      iVar23 = *(int *)&pRVar4[1].arena;
      *(int *)&pRVar4[1].arena = iVar23 + 1;
      *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar23 * 4) = 0x3f800000;
      if ((pCVar3->stride_).rep_ == (Rep *)0x0) {
        pWVar17 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar17);
        (pCVar3->stride_).rep_ = (Rep *)pWVar17;
      }
      pRVar4 = (pCVar3->stride_).rep_;
      if (pRVar4[4].arena == (Arena *)0x0) {
        pQVar18 = (QuantizationParams *)operator_new(0x28);
        CoreML::Specification::QuantizationParams::QuantizationParams(pQVar18);
        pRVar4[4].arena = (Arena *)pQVar18;
      }
      CoreML::validate<(MLModelType)500>(&local_40,&local_c0);
      bVar12 = CoreML::Result::good(&local_40);
      if (bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1715);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
LAB_00198aaf:
        std::ostream::put((char)poVar19);
        iVar23 = 1;
        std::ostream::flush();
      }
      else {
        psVar20 = CoreML::Result::message_abi_cxx11_(&local_40);
        lVar21 = std::__cxx11::string::find((char *)psVar20,0x302c17,0);
        if (lVar21 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1716);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19,"res2.message().find(\"quantized\") != std::string::npos",0x35);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
          goto LAB_00198aaf;
        }
        lVar7._0_4_ = (pCVar3->stride_).current_size_;
        lVar7._4_4_ = (pCVar3->stride_).total_size_;
        if (lVar7 == 0) {
          pWVar17 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar17);
          *(WeightParams **)&pCVar3->stride_ = pWVar17;
        }
        lVar21 = *(long *)&pCVar3->stride_;
        plVar8 = *(long **)(lVar21 + 0x40);
        if (plVar8 != (long *)0x0) {
          (**(code **)(*plVar8 + 8))();
        }
        *(undefined8 *)(lVar21 + 0x40) = 0;
        if ((pCVar3->stride_).rep_ == (Rep *)0x0) {
          pWVar17 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar17);
          (pCVar3->stride_).rep_ = (Rep *)pWVar17;
        }
        pRVar4 = (pCVar3->stride_).rep_;
        pAVar9 = pRVar4[4].arena;
        if (pAVar9 != (Arena *)0x0) {
          (**(code **)(*(long *)pAVar9 + 8))();
        }
        pRVar4[4].arena = (Arena *)0x0;
        lVar10._0_4_ = (pCVar3->stride_).current_size_;
        lVar10._4_4_ = (pCVar3->stride_).total_size_;
        if (lVar10 == 0) {
          pWVar17 = (WeightParams *)operator_new(0x50);
          CoreML::Specification::WeightParams::WeightParams(pWVar17);
          *(WeightParams **)&pCVar3->stride_ = pWVar17;
        }
        lVar21 = *(long *)&pCVar3->stride_;
        if (*(int *)(lVar21 + 0x10) == *(int *)(lVar21 + 0x14)) {
          google::protobuf::RepeatedField<float>::Reserve
                    ((RepeatedField<float> *)(lVar21 + 0x10),*(int *)(lVar21 + 0x14) + 1);
        }
        iVar23 = *(int *)(lVar21 + 0x10);
        *(int *)(lVar21 + 0x10) = iVar23 + 1;
        *(undefined4 *)(*(long *)(lVar21 + 0x18) + 8 + (long)iVar23 * 4) = 0x3f800000;
        CoreML::validate<(MLModelType)500>(&local_68,&local_c0);
        bVar12 = CoreML::Result::good(&local_68);
        if (bVar12) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x171f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
          std::ostream::put((char)poVar19);
          iVar23 = 1;
          std::ostream::flush();
        }
        else {
          psVar20 = CoreML::Result::message_abi_cxx11_(&local_68);
          lVar21 = std::__cxx11::string::find((char *)psVar20,0x302c8d,0);
          if (lVar21 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1720);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,"res3.message().find(\"Shape of gamma\") != std::string::npos",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19," was false, expected true.",0x1a);
            iVar23 = 1;
            std::endl<char,std::char_traits<char>>(poVar19);
          }
          else {
            lVar11._0_4_ = (pCVar3->stride_).current_size_;
            lVar11._4_4_ = (pCVar3->stride_).total_size_;
            if (lVar11 == 0) {
              pWVar17 = (WeightParams *)operator_new(0x50);
              CoreML::Specification::WeightParams::WeightParams(pWVar17);
              *(WeightParams **)&pCVar3->stride_ = pWVar17;
            }
            lVar21 = *(long *)&pCVar3->stride_;
            *(undefined4 *)(lVar21 + 0x10) = 0;
            if (lVar21 == 0) {
              pWVar17 = (WeightParams *)operator_new(0x50);
              CoreML::Specification::WeightParams::WeightParams(pWVar17);
              *(WeightParams **)&pCVar3->stride_ = pWVar17;
            }
            lVar21 = *(long *)&pCVar3->stride_;
            if (*(int *)(lVar21 + 0x10) == *(int *)(lVar21 + 0x14)) {
              google::protobuf::RepeatedField<float>::Reserve
                        ((RepeatedField<float> *)(lVar21 + 0x10),*(int *)(lVar21 + 0x14) + 1);
            }
            iVar23 = *(int *)(lVar21 + 0x10);
            *(int *)(lVar21 + 0x10) = iVar23 + 1;
            *(undefined4 *)(*(long *)(lVar21 + 0x18) + 8 + (long)iVar23 * 4) = 0x3f800000;
            if ((pCVar3->stride_).rep_ == (Rep *)0x0) {
              pWVar17 = (WeightParams *)operator_new(0x50);
              CoreML::Specification::WeightParams::WeightParams(pWVar17);
              (pCVar3->stride_).rep_ = (Rep *)pWVar17;
            }
            pRVar4 = (pCVar3->stride_).rep_;
            iVar23 = *(int *)((long)&pRVar4[1].arena + 4);
            if (*(int *)&pRVar4[1].arena == iVar23) {
              google::protobuf::RepeatedField<float>::Reserve
                        ((RepeatedField<float> *)(pRVar4 + 1),iVar23 + 1);
            }
            iVar23 = *(int *)&pRVar4[1].arena;
            *(int *)&pRVar4[1].arena = iVar23 + 1;
            *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar23 * 4) = 0x3f800000;
            if ((pCVar3->stride_).rep_ == (Rep *)0x0) {
              pWVar17 = (WeightParams *)operator_new(0x50);
              CoreML::Specification::WeightParams::WeightParams(pWVar17);
              (pCVar3->stride_).rep_ = (Rep *)pWVar17;
            }
            pRVar4 = (pCVar3->stride_).rep_;
            iVar23 = *(int *)((long)&pRVar4[1].arena + 4);
            if (*(int *)&pRVar4[1].arena == iVar23) {
              google::protobuf::RepeatedField<float>::Reserve
                        ((RepeatedField<float> *)(pRVar4 + 1),iVar23 + 1);
            }
            iVar23 = *(int *)&pRVar4[1].arena;
            *(int *)&pRVar4[1].arena = iVar23 + 1;
            *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar23 * 4) = 0x3f800000;
            CoreML::validate<(MLModelType)500>(&local_90,&local_c0);
            bVar12 = CoreML::Result::good(&local_90);
            if (bVar12) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1728);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!((res4).good())",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19," was false, expected true.",0x1a);
LAB_00198df3:
              iVar23 = 1;
              std::endl<char,std::char_traits<char>>(poVar19);
            }
            else {
              psVar20 = CoreML::Result::message_abi_cxx11_(&local_90);
              iVar23 = 0;
              lVar21 = std::__cxx11::string::find((char *)psVar20,0x302cd7,0);
              if (lVar21 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1729);
                std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,"res4.message().find(\"Shape of beta\") != std::string::npos",
                           0x39);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19," was false, expected true.",0x1a);
                goto LAB_00198df3;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90.m_message._M_dataplus._M_p != &local_90.m_message.field_2) {
              operator_delete(local_90.m_message._M_dataplus._M_p,
                              local_90.m_message.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.m_message._M_dataplus._M_p != &local_68.m_message.field_2) {
          operator_delete(local_68.m_message._M_dataplus._M_p,
                          local_68.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40.m_message._M_dataplus._M_p != &local_40.m_message.field_2) {
        operator_delete(local_40.m_message._M_dataplus._M_p,
                        local_40.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00198e5d;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x170d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,"res1.message().find(\"quantized\") != std::string::npos",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  }
  std::ostream::put((char)poVar19);
  iVar23 = 1;
  std::ostream::flush();
LAB_00198e5d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._8_8_ != &local_d0) {
    operator_delete((void *)local_e8._8_8_,local_d0._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_c0);
  return iVar23;
}

Assistant:

int testInvalidLayerNormalizationWrongGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_gamma()->mutable_quantization();

    // value of gamma and beta should be unquantized
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("quantized") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->mutable_quantization();

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("quantized") != std::string::npos);

    // shape of gamma and beta should be match normalized shape

    params->mutable_gamma()->clear_quantization();
    params->mutable_beta()->clear_quantization();
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Shape of gamma") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Shape of beta") != std::string::npos);

    return 0;
}